

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O0

Fad<float> * __thiscall Fad<float>::operator/=(Fad<float> *this,float *val)

{
  int iVar1;
  float *pfVar2;
  float *in_RSI;
  Fad<float> *in_RDI;
  int i;
  float *dxp;
  int sz;
  int local_24;
  
  in_RDI->val_ = in_RDI->val_ / *in_RSI;
  iVar1 = Vector<float>::size((Vector<float> *)0x10b8f96);
  if (iVar1 != 0) {
    pfVar2 = Vector<float>::begin(&in_RDI->dx_);
    for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
      pfVar2[local_24] = pfVar2[local_24] / *in_RSI;
    }
  }
  return in_RDI;
}

Assistant:

inline  Fad<T> & Fad<T>::operator/= (const T& val)
{
  val_ /= val;

  int sz = dx_.size();
  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    for (int i=0; i<sz;++i)
      dxp[i] /= val;
  }

  return *this;
}